

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void * __thiscall CVmVarHeapHybrid::alloc_mem(CVmVarHeapHybrid *this,size_t siz,CVmObject *param_3)

{
  size_t sVar1;
  long lVar2;
  size_t in_RSI;
  long in_RDI;
  CVmVarHeapHybrid_hdr *hdr;
  CVmVarHeapHybrid_hdr *hdr_1;
  size_t i;
  CVmVarHeapHybrid_head **subheap;
  ulong local_30;
  undefined8 *local_28;
  void *local_8;
  
  CVmObjTable::count_alloc(*(CVmObjTable **)(in_RDI + 0x28),in_RSI);
  local_30 = 0;
  local_28 = *(undefined8 **)(in_RDI + 0x10);
  do {
    if (*(ulong *)(in_RDI + 0x18) <= local_30) {
      lVar2 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x10))(*(long **)(in_RDI + 0x20),in_RSI);
LAB_00378fa5:
      local_8 = (void *)(lVar2 + 8);
      return local_8;
    }
    sVar1 = CVmVarHeapHybrid_head::get_cell_size((CVmVarHeapHybrid_head *)*local_28);
    if (in_RSI <= sVar1) {
      lVar2 = (**(code **)(*(long *)*local_28 + 0x10))((long *)*local_28,in_RSI);
      goto LAB_00378fa5;
    }
    local_30 = local_30 + 1;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void *CVmVarHeapHybrid::alloc_mem(size_t siz, CVmObject *)
{
    CVmVarHeapHybrid_head **subheap;
    size_t i;

    /* count the gc statistics if desired */
    IF_GC_STATS(gc_stats.count_alloc_bytes(siz));

    /* count the allocation */
    objtab_->count_alloc(siz);

    /* scan for a cell-based subheap that can handle the request */
    for (i = 0, subheap = cell_heaps_ ; i < cell_heap_cnt_ ; ++i, ++subheap)
    {
        /* 
         *   If it will fit in this one's cell size, allocate it from this
         *   subheap.  Note that we must adjust the return pointer so that
         *   it points to the caller-visible portion of the block returned
         *   from the subheap, which immediately follows the internal
         *   header.  
         */
        if (siz <= (*subheap)->get_cell_size())
        {
            CVmVarHeapHybrid_hdr *hdr = (*subheap)->alloc(siz);
            IF_GC_STATS(hdr->siz = siz);
            return (void *)(hdr + 1);
        }
    }

    /*
     *   We couldn't find a cell-based manager that can handle a block
     *   this large.  Allocate the block from the default malloc heap.
     *   Note that the caller-visible block is the part that immediately
     *   follows our internal header, so we must adjust the return pointer
     *   accordingly.  
     */
    CVmVarHeapHybrid_hdr *hdr = malloc_heap_->alloc(siz);
    IF_GC_STATS(hdr->siz = siz);
    return (void *)(hdr + 1);
}